

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O0

void __thiscall DictionaryStats::DictionaryStats(DictionaryStats *this,char *name,uint bucketCount)

{
  int iVar1;
  NoCheckHeapAllocator *alloc;
  DictionaryType *__s;
  TrackAllocData local_58;
  DictionaryType *local_30;
  DictionaryType *current;
  DictionaryType *type;
  char *pcStack_18;
  uint bucketCount_local;
  char *name_local;
  DictionaryStats *this_local;
  
  this->pNext = (DictionaryStats *)0x0;
  this->initialSize = bucketCount;
  this->finalSize = bucketCount;
  this->countOfEmptyBuckets = bucketCount;
  this->countOfResize = 0;
  this->itemCount = 0;
  this->maxDepth = 0;
  this->lookupCount = 0;
  this->collisionCount = 0;
  this->lookupDepthTotal = 0;
  this->maxLookupDepth = 0;
  this->pName = (char *)0x0;
  type._4_4_ = bucketCount;
  pcStack_18 = name;
  name_local = (char *)this;
  CCLock::Enter(&dictionaryTypesCriticalSection.super_CCLock);
  current = (DictionaryType *)0x0;
  local_30 = dictionaryTypes;
  do {
    if (local_30 == (DictionaryType *)0x0) {
LAB_008d99bc:
      if (current == (DictionaryType *)0x0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_58,(type_info *)&DictionaryType::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryStats.cpp"
                   ,0x45);
        alloc = Memory::NoCheckHeapAllocator::TrackAllocInfo
                          ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,&local_58
                          );
        __s = (DictionaryType *)new<Memory::NoCheckHeapAllocator>(0x118,alloc,0x3d5f00);
        memset(__s,0,0x118);
        __s->pNext = dictionaryTypes;
        dictionaryTypes = __s;
        __s->instancesCount = 0;
        current = __s;
        strncpy_s<256ul>(&__s->name,pcStack_18,0xff);
        current->name[0xff] = '\0';
      }
      CCLock::Leave(&dictionaryTypesCriticalSection.super_CCLock);
      this->pName = current->name;
      this->pNext = current->instances;
      current->instances = this;
      current->instancesCount = current->instancesCount + 1;
      return;
    }
    iVar1 = strncmp(pcStack_18,local_30->name,0xff);
    if (iVar1 == 0) {
      current = local_30;
      goto LAB_008d99bc;
    }
    local_30 = local_30->pNext;
  } while( true );
}

Assistant:

DictionaryStats::DictionaryStats(const char* name, uint bucketCount)
    :
    initialSize(bucketCount),
    finalSize(bucketCount),
    countOfEmptyBuckets(bucketCount),
    countOfResize(0),
    itemCount(0),
    maxDepth(0),
    lookupCount(0),
    collisionCount(0),
    lookupDepthTotal(0),
    maxLookupDepth(0),
    pNext(NULL),
    pName(NULL)
{
    DictionaryStats::dictionaryTypesCriticalSection.Enter();
    DictionaryType* type = NULL;
    // See if we already created instance(s) of this type
    DictionaryType* current = dictionaryTypes;
    while(current)
    {
        if (strncmp(name, current->name, _countof(current->name)-1) == 0)
        {
            type = current;
            break;
        }
        current = current->pNext;
    }

    if (!type)
    {
        // We haven't seen this type before so add a new entry for it
        type = NoCheckHeapNew(DictionaryType);
        type->pNext = dictionaryTypes;
        dictionaryTypes = type;
        type->instancesCount = 0;
        strncpy_s(type->name, name, _countof(type->name)-1);
        type->name[sizeof(type->name)-1]='\0';
    }
    dictionaryTypesCriticalSection.Leave();
    // keep a pointer to the name in case we are asked to clone ourselves
    pName = type->name;

    // Add ourself in the list
    pNext = type->instances;
    type->instances = this;
    ++(type->instancesCount);
}